

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O2

void __thiscall KeyValueFile::errorParam(KeyValueFile *this,char *msg,char *key_name)

{
  string err;
  allocator<char> local_11a;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->printErrorFunc != (PrintErrorFunc)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ERROR: ",&local_119);
    std::operator+(&local_d8,&local_f8,msg);
    std::operator+(&local_b8,&local_d8,", at file \'");
    std::operator+(&local_98,&local_b8,&this->fileName);
    std::operator+(&local_78,&local_98,"\', key \'");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,key_name,&local_11a);
    std::operator+(&local_58,&local_78,&local_118);
    std::operator+(&local_38,&local_58,"\'\n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    (*this->printErrorFunc)(local_38._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void errorParam(const char * msg, const char * key_name) const
  {
    if (printErrorFunc)
    {
      std::string err = std::string("ERROR: ") + msg + ", at file '" + fileName +  "', key '" + std::string(key_name) + "'\n";
      printErrorFunc(err.c_str());
    }
  }